

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename,uint quality)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  CImgInstanceException *this_01;
  FILE *pFVar9;
  CImgIOException *this_02;
  uint in_EDX;
  char *in_RSI;
  CImg<unsigned_char> *in_RDI;
  FILE *file;
  char filetmp [512];
  char command [1024];
  CImg<unsigned_char> *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  undefined1 reinit_path;
  char *in_stack_fffffffffffff8f0;
  char *local_6c8;
  char local_638 [48];
  char local_438 [855];
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  
  if (in_RSI == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar6 = is_empty(in_RDI);
  if (!bVar6) {
    memset(local_438,0,0x400);
    memset(local_638,0,0x200);
    do {
      pcVar7 = cimg::temporary_path(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
      pcVar8 = cimg::filenamerand();
      if (in_RDI->_spectrum == 1) {
        local_6c8 = "pgm";
      }
      else {
        local_6c8 = "ppm";
      }
      snprintf(local_638,0x200,"%s%c%s.%s",pcVar7,0x2f,pcVar8);
      pFVar9 = fopen(local_638,"rb");
      if (pFVar9 != (FILE *)0x0) {
        cimg::fclose(pFVar9);
      }
      reinit_path = (undefined1)((ulong)in_stack_fffffffffffff8e8 >> 0x38);
    } while (pFVar9 != (FILE *)0x0);
    save_pnm(in_stack_fffffffffffff8e0,local_6c8,0);
    pcVar7 = cimg::graphicsmagick_path(in_stack_fffffffffffff8f0,(bool)reinit_path);
    snprintf(local_438,0x400,"%s -quality %u%% \"%s\" \"%s\"",pcVar7,(ulong)in_EDX,local_638,in_RSI)
    ;
    cimg::system(local_438);
    pFVar9 = fopen(in_RSI,"rb");
    if (pFVar9 == (FILE *)0x0) {
      this_02 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      uVar1 = in_RDI->_width;
      uVar2 = in_RDI->_height;
      uVar3 = in_RDI->_depth;
      uVar4 = in_RDI->_spectrum;
      puVar5 = in_RDI->_data;
      pcVar7 = "non-";
      if ((in_RDI->_is_shared & 1U) != 0) {
        pcVar7 = "";
      }
      pcVar8 = pixel_type();
      CImgIOException::CImgIOException
                (this_02,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Failed to save file \'%s\' with external command \'gm\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,in_RSI);
      __cxa_throw(this_02,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
    if (pFVar9 != (FILE *)0x0) {
      cimg::fclose(pFVar9);
    }
    remove(local_638);
    return in_RDI;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  uVar1 = in_RDI->_width;
  uVar2 = in_RDI->_height;
  uVar3 = in_RDI->_depth;
  uVar4 = in_RDI->_spectrum;
  puVar5 = in_RDI->_data;
  pcVar7 = "non-";
  if ((in_RDI->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Empty instance, for file \'%s\'."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,in_RSI);
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const CImg<T>& save_graphicsmagick_external(const char *const filename, const unsigned int quality=100) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_graphicsmagick_external() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file;
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.%s",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),_spectrum==1?"pgm":"ppm");
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      save_pnm(filetmp);
      cimg_snprintf(command,sizeof(command),"%s -quality %u%% \"%s\" \"%s\"",cimg::graphicsmagick_path(),quality,filetmp,filename);
      cimg::system(command);
      file = std::fopen(filename,"rb");
      if (!file)
        throw CImgIOException(_cimg_instance
                              "save_graphicsmagick_external() : Failed to save file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      if (file) cimg::fclose(file);
      std::remove(filetmp);
      return *this;
    }